

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_ncc_rule.cpp
# Opt level: O3

void r8vec_linspace(int n,double a_first,double a_last,double *a)

{
  int iVar1;
  ulong uVar2;
  double dVar3;
  
  if (n == 1) {
    *a = (a_first + a_last) * 0.5;
    return;
  }
  if (0 < n) {
    iVar1 = n + -1;
    dVar3 = (double)iVar1;
    uVar2 = 0;
    do {
      a[uVar2] = ((double)iVar1 * a_first + (double)(int)uVar2 * a_last) / dVar3;
      uVar2 = uVar2 + 1;
      iVar1 = iVar1 + -1;
    } while ((uint)n != uVar2);
  }
  return;
}

Assistant:

void r8vec_linspace ( int n, double a_first, double a_last, double a[] )

//****************************************************************************80
//
//  Purpose:
//
//    R8VEC_LINSPACE creates a vector of linearly spaced values.
//
//  Discussion:
//
//    An R8VEC is a vector of R8's.
//
//    4 points evenly spaced between 0 and 12 will yield 0, 4, 8, 12.
//
//    In other words, the interval is divided into N-1 even subintervals,
//    and the endpoints of intervals are used as the points.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 April 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, double A_FIRST, A_LAST, the first and last entries.
//
//    Output, double A[N], a vector of linearly spaced data.
//
{
  int i;

  if ( n == 1 )
  {
    a[0] = ( a_first + a_last ) / 2.0;
  }
  else
  {
    for ( i = 0; i < n; i++ )
    {
      a[i] = ( double( n - 1 - i ) * a_first 
             + double(         i ) * a_last ) 
             / double( n - 1     );
    }
  }
  return;
}